

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O0

void forth_damage(Forth *ptr)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  runtime_error *this;
  int num;
  Forth *ptr_local;
  
  iVar2 = ForthToInt(ptr);
  bVar1 = cppforth::Forth::forth_available(ptr,1);
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"forth_loc_y does not have space in Forth stack");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar3 = c_damage((long)iVar2);
  cppforth::Forth::forth_push(ptr,(Cell)lVar3);
  return;
}

Assistant:

void forth_damage(cppforth::Forth* ptr){
	int num = ForthToInt(ptr);
	if (ptr->forth_available(1)){
		ptr->forth_push(c_damage(num));
	}
	else {
		throw std::runtime_error(("forth_loc_y does not have space in Forth stack"));
	}
}